

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O1

MPP_RET init_dpb(H264dVideoCtx_t *p_Vid,H264_DpbBuf_t *p_Dpb,RK_S32 type)

{
  h264_sps_t *phVar1;
  h264_frame_store_t *phVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  h264_frame_store_t **pphVar6;
  H264_FrameStore_t *pHVar7;
  H264_StorePic_t *pHVar8;
  byte bVar9;
  int iVar10;
  MPP_RET MVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  undefined8 uVar16;
  long lVar17;
  RK_U32 RVar18;
  
  phVar1 = p_Vid->active_sps;
  if (phVar1 == (h264_sps_t *)0x0) {
    return MPP_NOK;
  }
  p_Dpb->p_Vid = p_Vid;
  if (p_Dpb->init_done != 0) {
    free_dpb(p_Dpb);
  }
  uVar4 = ((phVar1->pic_height_in_map_units_minus1 + 1) * (phVar1->pic_width_in_mbs_minus1 + 1) <<
          (phVar1->frame_mbs_only_flag == 0)) * 0x180;
  uVar5 = 0x25200;
  switch(phVar1->level_idc) {
  case 9:
  case 10:
    break;
  case 0xb:
    RVar18 = is_prext_profile(phVar1->profile_idc);
    if ((RVar18 != 0) || (phVar1->constrained_set3_flag != 1)) {
      uVar5 = 0x54600;
    }
    break;
  case 0xc:
  case 0xd:
  case 0x14:
    uVar5 = 0xdec00;
    break;
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x17:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
switchD_00195e49_caseD_e:
    uVar5 = 0;
    break;
  case 0x15:
    uVar5 = 0x1bd800;
    break;
  case 0x16:
  case 0x1e:
    uVar5 = 0x2f7600;
    break;
  case 0x1f:
    uVar5 = 0x697800;
    break;
  case 0x20:
    uVar5 = 0x780000;
    break;
  default:
    switch(phVar1->level_idc) {
    case 0x28:
    case 0x29:
      uVar5 = 0xc00000;
      break;
    case 0x2a:
      uVar5 = 0xcc0000;
      break;
    default:
      goto switchD_00195e49_caseD_e;
    case 0x32:
      uVar5 = 0x286e000;
      break;
    case 0x33:
    case 0x34:
      uVar5 = 0x4380000;
    }
  }
  uVar5 = (uint)((long)(ulong)uVar5 / (long)(int)uVar4);
  if ((p_Vid->active_mvc_sps_flag == 0) ||
     ((p_Vid->profile_idc != 0x80 && (p_Vid->profile_idc != 0x76)))) {
    uVar13 = 0x10;
    if ((int)uVar5 < 0x10) {
      uVar13 = uVar5;
    }
  }
  else {
    iVar12 = p_Vid->active_subsps->num_views_minus1 + 1;
    iVar10 = iVar12 * iVar12;
    iVar14 = 0;
    do {
      iVar15 = iVar14 + 1;
      bVar9 = (byte)iVar14;
      iVar14 = iVar15;
    } while (2 << (bVar9 & 0x1f) <= iVar10);
    uVar5 = uVar5 * 2;
    uVar13 = 0x10;
    if (iVar15 != 1) {
      uVar13 = 0;
      bVar9 = 0;
      do {
        bVar3 = bVar9 & 0x1f;
        bVar9 = bVar9 + 1;
        uVar13 = uVar13 + 8;
      } while (2 << bVar3 <= iVar10);
      uVar13 = uVar13 & 0x7ffffff0;
    }
    if ((int)uVar13 < (int)uVar5) {
      iVar14 = 0;
      do {
        iVar15 = iVar14 + 1;
        bVar9 = (byte)iVar14;
        iVar14 = iVar15;
      } while (2 << (bVar9 & 0x1f) <= iVar10);
      uVar5 = 0x10;
      if (iVar15 != 1) {
        uVar5 = 0;
        bVar9 = 0;
        do {
          bVar3 = bVar9 & 0x1f;
          bVar9 = bVar9 + 1;
          uVar5 = uVar5 + 8;
        } while (2 << bVar3 <= iVar10);
        uVar5 = uVar5 & 0x7ffffff0;
      }
    }
    uVar13 = (int)uVar5 / iVar12;
  }
  uVar5 = uVar13;
  if ((phVar1->vui_parameters_present_flag != 0) &&
     ((phVar1->vui_seq_parameters).bitstream_restriction_flag != 0)) {
    if (((int)uVar13 < (int)(phVar1->vui_seq_parameters).max_dec_frame_buffering) &&
       (((byte)h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb","warnnig: max_dec_frame_buffering larger than MaxDpbSize",(char *)0x0
                );
    }
    RVar18 = (phVar1->vui_seq_parameters).max_dec_frame_buffering;
    uVar5 = RVar18 + (RVar18 == 0);
    if (((int)uVar5 < (int)uVar13) && (((byte)h264d_debug & 4) != 0)) {
      _mpp_log_l(4,"h264d_dpb",
                 "warning: max_dec_frame_buffering(%d) is less than dpb_size(%d) calculated from Profile/Level.\n"
                 ,(char *)0x0,(ulong)uVar5,(ulong)uVar13);
    }
  }
  if ((int)uVar5 < phVar1->max_num_ref_frames) {
    if (((byte)h264d_debug & 4) != 0) {
      _mpp_log_l(4,"h264d_dpb",
                 "warnning: DPB size is less than max_num_ref_frames, level(%d), pic_size(%d), max_num_ref_frames(%d).\n"
                 ,(char *)0x0,(ulong)(uint)phVar1->level_idc,(ulong)uVar4,phVar1->max_num_ref_frames
                );
    }
    uVar5 = 0x10;
    if (phVar1->max_num_ref_frames < 0x10) {
      uVar5 = phVar1->max_num_ref_frames;
    }
  }
  RVar18 = uVar5 + (uVar5 == 0);
  p_Dpb->size = RVar18;
  p_Dpb->allocated_size = RVar18;
  iVar14 = phVar1->max_num_ref_frames;
  p_Dpb->num_ref_frames = iVar14;
  if ((phVar1->max_dec_frame_buffering < iVar14) && (((byte)h264d_debug & 4) != 0)) {
    _mpp_log_l(4,"h264d_dpb","DPB size at specified level is smaller than reference frames",
               (char *)0x0);
  }
  p_Dpb->used_size = 0;
  p_Dpb->last_picture = (h264_frame_store_t *)0x0;
  p_Dpb->ref_frames_in_buffer = 0;
  p_Dpb->ltref_frames_in_buffer = 0;
  pphVar6 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
  p_Dpb->fs = pphVar6;
  pphVar6 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
  p_Dpb->fs_ref = pphVar6;
  pphVar6 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",(ulong)p_Dpb->size << 3);
  p_Dpb->fs_ltref = pphVar6;
  pphVar6 = (h264_frame_store_t **)mpp_osal_calloc("init_dpb",8);
  p_Dpb->fs_ilref = pphVar6;
  if (((p_Dpb->fs == (h264_frame_store_t **)0x0) || (p_Dpb->fs_ref == (h264_frame_store_t **)0x0))
     || (pphVar6 == (h264_frame_store_t **)0x0 || p_Dpb->fs_ltref == (h264_frame_store_t **)0x0)) {
    if (((byte)h264d_debug & 1) == 0) {
      return MPP_ERR_MALLOC;
    }
    uVar16 = 0x7c3;
LAB_0019616e:
    MVar11 = MPP_ERR_MALLOC;
    _mpp_log_l(4,"h264d_dpb","malloc buffer error(%d).\n",(char *)0x0,uVar16);
  }
  else {
    if (p_Dpb->size != 0) {
      lVar17 = 0;
      do {
        pHVar7 = alloc_frame_store();
        p_Dpb->fs[lVar17] = pHVar7;
        if (p_Dpb->fs[lVar17] == (h264_frame_store_t *)0x0) {
          if (((byte)h264d_debug & 1) == 0) {
            return MPP_ERR_MALLOC;
          }
          uVar16 = 0x7c6;
          goto LAB_0019616e;
        }
        p_Dpb->fs_ref[lVar17] = (h264_frame_store_t *)0x0;
        p_Dpb->fs_ltref[lVar17] = (h264_frame_store_t *)0x0;
        phVar2 = p_Dpb->fs[lVar17];
        phVar2->layer_id = -1;
        phVar2->view_id = -1;
        phVar2->inter_view_flag[0] = 0;
        phVar2->inter_view_flag[1] = 0;
        phVar2->anchor_pic_flag[0] = 0;
        phVar2->anchor_pic_flag[1] = 0;
        lVar17 = lVar17 + 1;
      } while ((uint)lVar17 < p_Dpb->size);
    }
    if (type == 2) {
      pHVar7 = alloc_frame_store();
      *p_Dpb->fs_ilref = pHVar7;
      phVar2 = *p_Dpb->fs_ilref;
      if (phVar2 == (h264_frame_store_t *)0x0) {
        if (((byte)h264d_debug & 1) == 0) {
          return MPP_ERR_MALLOC;
        }
        uVar16 = 2000;
        goto LAB_0019616e;
      }
      phVar2->view_id = -1;
      phVar2->inter_view_flag[0] = 0;
      phVar2->inter_view_flag[1] = 0;
      phVar2->anchor_pic_flag[0] = 0;
      phVar2->anchor_pic_flag[1] = 0;
    }
    else {
      *p_Dpb->fs_ilref = (h264_frame_store_t *)0x0;
    }
    if (p_Vid->no_ref_pic == (h264_store_pic_t *)0x0) {
      pHVar8 = alloc_storable_picture(p_Vid,3);
      p_Vid->no_ref_pic = pHVar8;
      if (pHVar8 == (H264_StorePic_t *)0x0) {
        if (((byte)h264d_debug & 1) == 0) {
          return MPP_ERR_MALLOC;
        }
        uVar16 = 0x7dc;
        goto LAB_0019616e;
      }
      pHVar8->top_field = pHVar8;
      pHVar8->bottom_field = pHVar8;
      pHVar8->frame = pHVar8;
    }
    p_Dpb->last_output_poc = -0x80000000;
    p_Dpb->last_output_view_id = -1;
    p_Vid->last_has_mmco_5 = 0;
    p_Dpb->init_done = 1;
    MVar11 = MPP_OK;
  }
  return MVar11;
}

Assistant:

MPP_RET init_dpb(H264dVideoCtx_t *p_Vid, H264_DpbBuf_t *p_Dpb, RK_S32 type)  // type=1 AVC type=2 MVC
{
    RK_U32 i = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264_SPS_t *active_sps = p_Vid->active_sps;
    RK_U32 dpb_size;

    if (!active_sps) {
        ret = MPP_NOK;
        goto __FAILED;
    }
    p_Dpb->p_Vid = p_Vid;
    if (p_Dpb->init_done) {
        free_dpb(p_Dpb);
    }
    dpb_size = getDpbSize(p_Vid, active_sps);
    p_Dpb->size = MPP_MAX(1, dpb_size);
    p_Dpb->allocated_size = p_Dpb->size;
    p_Dpb->num_ref_frames = active_sps->max_num_ref_frames;
    if (active_sps->max_dec_frame_buffering < active_sps->max_num_ref_frames) {
        H264D_WARNNING("DPB size at specified level is smaller than reference frames");
    }
    p_Dpb->used_size = 0;
    p_Dpb->last_picture = NULL;
    p_Dpb->ref_frames_in_buffer = 0;
    p_Dpb->ltref_frames_in_buffer = 0;
    //--------
    p_Dpb->fs       = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ref   = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ltref = mpp_calloc(H264_FrameStore_t*, p_Dpb->size);
    p_Dpb->fs_ilref = mpp_calloc(H264_FrameStore_t*, 1);  //!< inter-layer reference (for multi-layered codecs)
    MEM_CHECK(ret, p_Dpb->fs && p_Dpb->fs_ref && p_Dpb->fs_ltref && p_Dpb->fs_ilref);
    for (i = 0; i < p_Dpb->size; i++) {
        p_Dpb->fs[i] = alloc_frame_store();
        MEM_CHECK(ret, p_Dpb->fs[i]);
        p_Dpb->fs_ref[i] = NULL;
        p_Dpb->fs_ltref[i] = NULL;
        p_Dpb->fs[i]->layer_id = -1;
        p_Dpb->fs[i]->view_id = -1;
        p_Dpb->fs[i]->inter_view_flag[0] = p_Dpb->fs[i]->inter_view_flag[1] = 0;
        p_Dpb->fs[i]->anchor_pic_flag[0] = p_Dpb->fs[i]->anchor_pic_flag[1] = 0;
    }
    if (type == 2) {
        p_Dpb->fs_ilref[0] = alloc_frame_store();
        MEM_CHECK(ret, p_Dpb->fs_ilref[0]);
        //!< These may need some cleanups
        p_Dpb->fs_ilref[0]->view_id = -1;
        p_Dpb->fs_ilref[0]->inter_view_flag[0] = p_Dpb->fs_ilref[0]->inter_view_flag[1] = 0;
        p_Dpb->fs_ilref[0]->anchor_pic_flag[0] = p_Dpb->fs_ilref[0]->anchor_pic_flag[1] = 0;
        //!< given that this is in a different buffer, do we even need proc_flag anymore?
    } else {
        p_Dpb->fs_ilref[0] = NULL;
    }
    //!< allocate a dummy storable picture
    if (!p_Vid->no_ref_pic) {
        p_Vid->no_ref_pic = alloc_storable_picture(p_Vid, FRAME);
        MEM_CHECK(ret, p_Vid->no_ref_pic);
        p_Vid->no_ref_pic->top_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->bottom_field = p_Vid->no_ref_pic;
        p_Vid->no_ref_pic->frame = p_Vid->no_ref_pic;
    }
    p_Dpb->last_output_poc = INT_MIN;
    p_Dpb->last_output_view_id = -1;
    p_Vid->last_has_mmco_5 = 0;
    p_Dpb->init_done = 1;

    return ret = MPP_OK;
__FAILED:
    return ret;
}